

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O0

int xmlShellSave(xmlShellCtxtPtr ctxt,char *filename,xmlNodePtr node,xmlNodePtr node2)

{
  xmlElementType xVar1;
  xmlGenericErrorFunc p_Var2;
  int iVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  xmlNodePtr node2_local;
  xmlNodePtr node_local;
  char *filename_local;
  xmlShellCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlShellCtxtPtr)0x0) || (ctxt->doc == (xmlDocPtr)0x0)) {
    ctxt_local._4_4_ = -1;
  }
  else {
    if ((filename == (char *)0x0) || (node_local = (xmlNodePtr)filename, *filename == '\0')) {
      node_local = (xmlNodePtr)ctxt->filename;
    }
    if (node_local == (xmlNodePtr)0x0) {
      ctxt_local._4_4_ = -1;
    }
    else {
      xVar1 = ctxt->doc->type;
      if (xVar1 == XML_DOCUMENT_NODE) {
        iVar3 = xmlSaveFile((char *)node_local,ctxt->doc);
        if (iVar3 < 0) {
          pp_Var4 = __xmlGenericError();
          p_Var2 = *pp_Var4;
          ppvVar5 = __xmlGenericErrorContext();
          (*p_Var2)(*ppvVar5,"Failed to save to %s\n",node_local);
        }
      }
      else {
        if (xVar1 != XML_HTML_DOCUMENT_NODE) {
          pp_Var4 = __xmlGenericError();
          p_Var2 = *pp_Var4;
          ppvVar5 = __xmlGenericErrorContext();
          (*p_Var2)(*ppvVar5,"To save to subparts of a document use the \'write\' command\n");
          return -1;
        }
        iVar3 = htmlSaveFile((char *)node_local,ctxt->doc);
        if (iVar3 < 0) {
          pp_Var4 = __xmlGenericError();
          p_Var2 = *pp_Var4;
          ppvVar5 = __xmlGenericErrorContext();
          (*p_Var2)(*ppvVar5,"Failed to save to %s\n",node_local);
        }
      }
      ctxt_local._4_4_ = 0;
    }
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlShellSave(xmlShellCtxtPtr ctxt, char *filename,
             xmlNodePtr node ATTRIBUTE_UNUSED,
             xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    if ((ctxt == NULL) || (ctxt->doc == NULL))
        return (-1);
    if ((filename == NULL) || (filename[0] == 0))
        filename = ctxt->filename;
    if (filename == NULL)
        return (-1);
#ifdef W_OK
    if (access((char *) filename, W_OK)) {
        xmlGenericError(xmlGenericErrorContext,
                        "Cannot save to %s\n", filename);
        return (-1);
    }
#endif
    switch (ctxt->doc->type) {
        case XML_DOCUMENT_NODE:
            if (xmlSaveFile((char *) filename, ctxt->doc) < 0) {
                xmlGenericError(xmlGenericErrorContext,
                                "Failed to save to %s\n", filename);
            }
            break;
        case XML_HTML_DOCUMENT_NODE:
#ifdef LIBXML_HTML_ENABLED
            if (htmlSaveFile((char *) filename, ctxt->doc) < 0) {
                xmlGenericError(xmlGenericErrorContext,
                                "Failed to save to %s\n", filename);
            }
#else
            if (xmlSaveFile((char *) filename, ctxt->doc) < 0) {
                xmlGenericError(xmlGenericErrorContext,
                                "Failed to save to %s\n", filename);
            }
#endif /* LIBXML_HTML_ENABLED */
            break;
        default:
            xmlGenericError(xmlGenericErrorContext,
	    "To save to subparts of a document use the 'write' command\n");
            return (-1);

    }
    return (0);
}